

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::BeginColumns(char *str_id,int columns_count,ImGuiColumnsFlags flags)

{
  float fVar1;
  ImVec2 IVar2;
  ImGuiWindow *window;
  ImGuiColumns *pIVar3;
  undefined1 auVar4 [16];
  ImGuiContext *pIVar5;
  ImGuiID id;
  int iVar6;
  ImGuiColumns *pIVar7;
  ImGuiColumnData *pIVar8;
  ImGuiColumnData *pIVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ImGuiContext *g;
  uint uVar14;
  uint uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  pIVar5 = GImGui;
  window = GImGui->CurrentWindow;
  window->WriteAccessed = true;
  id = GetColumnsID(str_id,columns_count);
  pIVar7 = FindOrCreateColumns(window,id);
  pIVar7->Current = 0;
  pIVar7->Count = columns_count;
  pIVar7->Flags = flags;
  (window->DC).CurrentColumns = pIVar7;
  pIVar7->HostCursorPosY = (window->DC).CursorPos.y;
  pIVar7->HostCursorMaxPosX = (window->DC).CursorMaxPos.x;
  IVar2 = (window->ClipRect).Max;
  (pIVar7->HostClipRect).Min = (window->ClipRect).Min;
  (pIVar7->HostClipRect).Max = IVar2;
  IVar2 = (window->WorkRect).Max;
  (pIVar7->HostWorkRect).Min = (window->WorkRect).Min;
  (pIVar7->HostWorkRect).Max = IVar2;
  fVar1 = (pIVar5->Style).ItemSpacing.x;
  fVar16 = (window->WindowPadding).x;
  fVar18 = fVar1 - fVar16;
  fVar16 = fVar16 * 0.5;
  uVar14 = -(uint)(window->WindowBorderSize <= fVar16);
  fVar17 = (window->WorkRect).Max.x;
  fVar18 = (float)(-(uint)(0.0 <= fVar18) & (uint)fVar18);
  fVar19 = (fVar1 + fVar17) - fVar18;
  fVar17 = (float)(int)(float)(~uVar14 & (uint)window->WindowBorderSize | (uint)fVar16 & uVar14) +
           fVar17;
  if (fVar17 <= fVar19) {
    fVar19 = fVar17;
  }
  fVar18 = ((window->DC).Indent.x - fVar1) + fVar18;
  pIVar7->OffMinX = fVar18;
  fVar19 = fVar19 - (window->Pos).x;
  fVar18 = fVar18 + 1.0;
  uVar14 = -(uint)(fVar18 <= fVar19);
  pIVar7->OffMaxX = (float)(~uVar14 & (uint)fVar18 | (uint)fVar19 & uVar14);
  fVar16 = (window->DC).CursorPos.y;
  pIVar7->LineMaxY = fVar16;
  pIVar7->LineMinY = fVar16;
  iVar13 = (pIVar7->Columns).Size;
  iVar10 = columns_count + 1;
  if (iVar13 == iVar10 || iVar13 == 0) {
    pIVar7->IsFirstFrame = iVar13 == 0;
    if (iVar13 == 0) {
      iVar13 = (pIVar7->Columns).Capacity;
      goto LAB_00195a29;
    }
  }
  else {
    iVar13 = (pIVar7->Columns).Capacity;
    if (iVar13 < 0) {
      iVar13 = 0;
      pIVar8 = (ImGuiColumnData *)MemAlloc(0);
      pIVar9 = (pIVar7->Columns).Data;
      if (pIVar9 != (ImGuiColumnData *)0x0) {
        memcpy(pIVar8,pIVar9,(long)(pIVar7->Columns).Size * 0x1c);
        MemFree((pIVar7->Columns).Data);
      }
      (pIVar7->Columns).Data = pIVar8;
      (pIVar7->Columns).Capacity = 0;
    }
    (pIVar7->Columns).Size = 0;
    pIVar7->IsFirstFrame = true;
LAB_00195a29:
    if (iVar13 <= columns_count) {
      pIVar8 = (ImGuiColumnData *)MemAlloc((long)iVar10 * 0x1c);
      pIVar9 = (pIVar7->Columns).Data;
      if (pIVar9 != (ImGuiColumnData *)0x0) {
        memcpy(pIVar8,pIVar9,(long)(pIVar7->Columns).Size * 0x1c);
        MemFree((pIVar7->Columns).Data);
      }
      (pIVar7->Columns).Data = pIVar8;
      (pIVar7->Columns).Capacity = iVar10;
    }
    if (columns_count < 0) goto LAB_00195c9b;
    iVar13 = (pIVar7->Columns).Size;
    iVar11 = 0;
    do {
      if (iVar13 == (pIVar7->Columns).Capacity) {
        if (iVar13 == 0) {
          iVar6 = 8;
        }
        else {
          iVar6 = iVar13 / 2 + iVar13;
        }
        iVar12 = iVar13 + 1;
        if (iVar13 + 1 < iVar6) {
          iVar12 = iVar6;
        }
        pIVar9 = (ImGuiColumnData *)MemAlloc((long)iVar12 * 0x1c);
        pIVar8 = (pIVar7->Columns).Data;
        if (pIVar8 != (ImGuiColumnData *)0x0) {
          memcpy(pIVar9,pIVar8,(long)(pIVar7->Columns).Size * 0x1c);
          MemFree((pIVar7->Columns).Data);
        }
        (pIVar7->Columns).Data = pIVar9;
        (pIVar7->Columns).Capacity = iVar12;
        iVar13 = (pIVar7->Columns).Size;
      }
      else {
        pIVar9 = (pIVar7->Columns).Data;
      }
      pIVar9[iVar13].OffsetNorm = (float)iVar11 / (float)columns_count;
      pIVar8 = pIVar9 + iVar13;
      pIVar8->OffsetNormBeforeResize = 0.0;
      pIVar8->Flags = 0;
      (((ImRect *)(&pIVar8->OffsetNormBeforeResize + 2))->Min).x = 0.0;
      (((ImRect *)(&pIVar8->OffsetNormBeforeResize + 2))->Min).y = 0.0;
      pIVar9[iVar13].ClipRect.Max.x = 0.0;
      pIVar9[iVar13].ClipRect.Max.y = 0.0;
      iVar13 = (pIVar7->Columns).Size + 1;
      (pIVar7->Columns).Size = iVar13;
      iVar11 = iVar11 + 1;
    } while (iVar10 != iVar11);
  }
  auVar4 = _DAT_0021fc00;
  if (0 < columns_count) {
    iVar13 = 0;
    do {
      pIVar3 = (GImGui->CurrentWindow->DC).CurrentColumns;
      if (pIVar3 == (ImGuiColumns *)0x0) {
        fVar17 = 0.0;
        fVar16 = 0.0;
      }
      else {
        pIVar9 = (pIVar3->Columns).Data;
        fVar16 = pIVar3->OffMinX;
        fVar19 = pIVar3->OffMaxX - fVar16;
        fVar17 = pIVar9[iVar13].OffsetNorm * fVar19 + fVar16;
        fVar16 = fVar19 * pIVar9[iVar13 + 1].OffsetNorm + fVar16;
      }
      iVar10 = iVar13 + 1;
      pIVar9 = (pIVar7->Columns).Data;
      fVar19 = (window->Pos).x;
      fVar17 = (float)(int)(fVar17 + fVar19 + 0.5);
      fVar16 = (float)(int)(fVar16 + fVar19 + -1.0 + 0.5);
      pIVar9[iVar13].ClipRect.Min.x = fVar17;
      pIVar9[iVar13].ClipRect.Min.y = -3.4028235e+38;
      pIVar9[iVar13].ClipRect.Max.x = fVar16;
      pIVar9[iVar13].ClipRect.Max.y = 3.4028235e+38;
      IVar2 = (window->ClipRect).Min;
      fVar19 = IVar2.x;
      fVar18 = IVar2.y;
      uVar14 = -(uint)(fVar19 <= fVar17);
      uVar15 = -(uint)(fVar18 <= -3.4028235e+38);
      pIVar9[iVar13].ClipRect.Min =
           (ImVec2)(CONCAT44(~uVar15 & (uint)fVar18,~uVar14 & (uint)fVar19) |
                   CONCAT44(uVar15,(uint)fVar17 & uVar14) & 0xff7fffffffffffff);
      auVar21._8_8_ = 0;
      auVar21._0_4_ = (window->ClipRect).Max.x;
      auVar21._4_4_ = (window->ClipRect).Max.y;
      auVar20._4_12_ = auVar4._4_12_;
      auVar20._0_4_ = fVar16;
      auVar21 = minps(auVar20,auVar21);
      pIVar9[iVar13].ClipRect.Max = auVar21._0_8_;
      iVar13 = iVar10;
    } while (iVar10 < columns_count);
  }
LAB_00195c9b:
  if (1 < pIVar7->Count) {
    ImDrawListSplitter::Split(&window->DrawList->_Splitter,window->DrawList,pIVar7->Count + 1);
    ImDrawListSplitter::SetCurrentChannel(&window->DrawList->_Splitter,window->DrawList,1);
    pIVar9 = (((GImGui->CurrentWindow->DC).CurrentColumns)->Columns).Data;
    PushClipRect(&(pIVar9->ClipRect).Min,&(pIVar9->ClipRect).Max,false);
  }
  pIVar3 = (GImGui->CurrentWindow->DC).CurrentColumns;
  fVar17 = 0.0;
  fVar16 = 0.0;
  if (pIVar3 != (ImGuiColumns *)0x0) {
    iVar10 = pIVar7->Current;
    iVar13 = iVar10;
    if (iVar10 < 0) {
      iVar13 = pIVar3->Current;
    }
    pIVar9 = (pIVar3->Columns).Data;
    fVar16 = pIVar3->OffMinX;
    fVar19 = pIVar3->OffMaxX - fVar16;
    if (iVar10 < -1) {
      iVar10 = pIVar3->Current;
    }
    else {
      iVar10 = iVar10 + 1;
    }
    fVar17 = pIVar9[iVar13].OffsetNorm * fVar19 + fVar16;
    fVar16 = fVar19 * pIVar9[iVar10].OffsetNorm + fVar16;
  }
  PushItemWidth((fVar16 - fVar17) * 0.65);
  fVar19 = fVar1 - (window->WindowPadding).x;
  fVar19 = (float)(-(uint)(0.0 <= fVar19) & (uint)fVar19);
  (window->DC).ColumnsOffset.x = fVar19;
  fVar17 = (window->Pos).x;
  (window->DC).CursorPos.x = (float)(int)((window->DC).Indent.x + fVar17 + fVar19);
  (window->WorkRect).Max.x = (fVar16 + fVar17) - fVar1;
  return;
}

Assistant:

void ImGui::BeginColumns(const char* str_id, int columns_count, ImGuiColumnsFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    IM_ASSERT(columns_count >= 1 && columns_count <= 64);   // Maximum 64 columns
    IM_ASSERT(window->DC.CurrentColumns == NULL);           // Nested columns are currently not supported

    // Acquire storage for the columns set
    ImGuiID id = GetColumnsID(str_id, columns_count);
    ImGuiColumns* columns = FindOrCreateColumns(window, id);
    IM_ASSERT(columns->ID == id);
    columns->Current = 0;
    columns->Count = columns_count;
    columns->Flags = flags;
    window->DC.CurrentColumns = columns;

    columns->HostCursorPosY = window->DC.CursorPos.y;
    columns->HostCursorMaxPosX = window->DC.CursorMaxPos.x;
    columns->HostClipRect = window->ClipRect;
    columns->HostWorkRect = window->WorkRect;

    // Set state for first column
    // We aim so that the right-most column will have the same clipping width as other after being clipped by parent ClipRect
    const float column_padding = g.Style.ItemSpacing.x;
    const float half_clip_extend_x = ImFloor(ImMax(window->WindowPadding.x * 0.5f, window->WindowBorderSize));
    const float max_1 = window->WorkRect.Max.x + column_padding - ImMax(column_padding - window->WindowPadding.x, 0.0f);
    const float max_2 = window->WorkRect.Max.x + half_clip_extend_x;
    columns->OffMinX = window->DC.Indent.x - column_padding + ImMax(column_padding - window->WindowPadding.x, 0.0f);
    columns->OffMaxX = ImMax(ImMin(max_1, max_2) - window->Pos.x, columns->OffMinX + 1.0f);
    columns->LineMinY = columns->LineMaxY = window->DC.CursorPos.y;

    // Clear data if columns count changed
    if (columns->Columns.Size != 0 && columns->Columns.Size != columns_count + 1)
        columns->Columns.resize(0);

    // Initialize default widths
    columns->IsFirstFrame = (columns->Columns.Size == 0);
    if (columns->Columns.Size == 0)
    {
        columns->Columns.reserve(columns_count + 1);
        for (int n = 0; n < columns_count + 1; n++)
        {
            ImGuiColumnData column;
            column.OffsetNorm = n / (float)columns_count;
            columns->Columns.push_back(column);
        }
    }

    for (int n = 0; n < columns_count; n++)
    {
        // Compute clipping rectangle
        ImGuiColumnData* column = &columns->Columns[n];
        float clip_x1 = IM_ROUND(window->Pos.x + GetColumnOffset(n));
        float clip_x2 = IM_ROUND(window->Pos.x + GetColumnOffset(n + 1) - 1.0f);
        column->ClipRect = ImRect(clip_x1, -FLT_MAX, clip_x2, +FLT_MAX);
        column->ClipRect.ClipWith(window->ClipRect);
    }

    if (columns->Count > 1)
    {
        window->DrawList->ChannelsSplit(1 + columns->Count);
        window->DrawList->ChannelsSetCurrent(1);
        PushColumnClipRect(0);
    }

    // We don't generally store Indent.x inside ColumnsOffset because it may be manipulated by the user.
    float offset_0 = GetColumnOffset(columns->Current);
    float offset_1 = GetColumnOffset(columns->Current + 1);
    float width = offset_1 - offset_0;
    PushItemWidth(width * 0.65f);
    window->DC.ColumnsOffset.x = ImMax(column_padding - window->WindowPadding.x, 0.0f);
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
    window->WorkRect.Max.x = window->Pos.x + offset_1 - column_padding;
}